

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::deliverMessage(CommonCore *this,ActionMessage *message)

{
  GlobalFederateId global_fedid;
  bool bVar1;
  route_id rVar2;
  GlobalHandle fed_id;
  BasicHandleInfo *handle;
  FederateState *this_00;
  string *psVar3;
  iterator iVar4;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  ulong uVar5;
  string_view name;
  
  global_fedid.gid = (message->dest_id).gid;
  if (message->messageAction != cmd_send_message) {
    rVar2 = getRoute(this,global_fedid);
    UNRECOVERED_JUMPTABLE_00 = (this->super_Core)._vptr_Core[0x6b];
    (*UNRECOVERED_JUMPTABLE_00)(this,(ulong)(uint)rVar2.rid,message,UNRECOVERED_JUMPTABLE_00);
    return;
  }
  if (global_fedid.gid == 0) {
    psVar3 = ActionMessage::getString_abi_cxx11_(message,0);
    name._M_str = (psVar3->_M_dataplus)._M_p;
    name._M_len = psVar3->_M_string_length;
    handle = HandleManager::getInterfaceHandle(&this->loopHandles,name,ENDPOINT);
  }
  else {
    fed_id.handle.hid = (message->dest_handle).hid;
    fed_id.fed_id.gid = global_fedid.gid;
    handle = HandleManager::findHandle(&this->loopHandles,fed_id);
  }
  if (handle == (BasicHandleInfo *)0x0) {
    psVar3 = ActionMessage::getString_abi_cxx11_(message,0);
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->knownExternalEndpoints)._M_h,psVar3);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
        ._M_cur == (__node_type *)0x0) {
      UNRECOVERED_JUMPTABLE_00 = (this->super_Core)._vptr_Core[0x6b];
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)*(uint *)((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_true>
                                     ._M_cur + 0x28);
      UNRECOVERED_JUMPTABLE_00 = (this->super_Core)._vptr_Core[0x6b];
    }
    (*UNRECOVERED_JUMPTABLE_00)(this,uVar5,message);
    return;
  }
  if (((handle->flags & 0x2000) != 0) &&
     (bVar1 = FilterFederate::destinationProcessMessage(this->filterFed,message,handle), !bVar1)) {
    return;
  }
  if ((message->dest_id).gid == 0) {
    (message->dest_id).gid = (handle->handle).fed_id.gid;
    (message->dest_handle).hid = (handle->handle).handle.hid;
  }
  this_00 = getFederateCore(this,(GlobalFederateId)(handle->handle).fed_id.gid);
  if (this_00 == (FederateState *)0x0) {
    if (((handle->handle).fed_id.gid == (this->translatorFedID)._M_i.gid) &&
       (this->translatorFed != (TranslatorFederate *)0x0)) {
      TranslatorFederate::handleMessage(this->translatorFed,message);
      return;
    }
    return;
  }
  FederateState::addAction(this_00,message);
  return;
}

Assistant:

void CommonCore::deliverMessage(ActionMessage& message)
{
    switch (message.action()) {
        case CMD_SEND_MESSAGE: {
            // Find the destination endpoint
            auto* localP = (message.dest_id == parent_broker_id) ?
                loopHandles.getInterfaceHandle(message.getString(targetStringLoc),
                                               InterfaceType::ENDPOINT) :
                loopHandles.findHandle(message.getDest());
            if (localP == nullptr) {
                auto kfnd = knownExternalEndpoints.find(message.getString(targetStringLoc));
                if (kfnd != knownExternalEndpoints.end()) {  // destination is known
                    transmit(kfnd->second, message);
                } else {
                    transmit(parent_route_id, message);
                }
                return;
            }
            // now we deal with local processing
            if (checkActionFlag(*localP, has_dest_filter_flag)) {
                if (!filterFed->destinationProcessMessage(message, localP)) {
                    return;
                }
            }
            if (message.dest_id == parent_broker_id) {
                message.dest_id = localP->getFederateId();
                message.dest_handle = localP->getInterfaceHandle();
            }

            auto* fed = getFederateCore(localP->getFederateId());
            if (fed != nullptr) {
                fed->addAction(std::move(message));
            } else if (localP->getFederateId() == translatorFedID) {
                if (translatorFed != nullptr) {
                    translatorFed->handleMessage(message);
                }
            }
            // else we just drop it as that is a weird condition so ignore it
        } break;
        case CMD_SEND_FOR_FILTER:
        case CMD_SEND_FOR_FILTER_AND_RETURN:
        case CMD_SEND_FOR_DEST_FILTER_AND_RETURN:
        case CMD_FILTER_RESULT:
        case CMD_DEST_FILTER_RESULT:
        case CMD_NULL_MESSAGE:
        case CMD_NULL_DEST_MESSAGE:
        default: {
            transmit(getRoute(message.dest_id), message);
        } break;
    }
}